

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O0

bool myutils::make_abs_dir(string *abs_path)

{
  int iVar1;
  char *pcVar2;
  string local_e8 [32];
  string local_c8 [8];
  string cmd;
  undefined1 local_a8 [8];
  stat s;
  string *abs_path_local;
  
  s.__glibc_reserved[2] = (__syscall_slong_t)abs_path;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(pcVar2,(stat *)local_a8);
  if (iVar1 == 0) {
    abs_path_local._7_1_ = true;
  }
  else {
    std::__cxx11::string::string(local_e8,(string *)s.__glibc_reserved[2]);
    std::operator+((char *)local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"mkdir -p ")
    ;
    std::__cxx11::string::~string(local_e8);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = system(pcVar2);
    abs_path_local._7_1_ = iVar1 == 0;
    std::__cxx11::string::~string(local_c8);
  }
  return abs_path_local._7_1_;
}

Assistant:

bool make_abs_dir(const std::string& abs_path)
    {
#ifdef _WIN32
        // if (!fs::exists(abs_path)) {
        //     return fs::create_directories(abs_path);
        // }
        // else {
        //     return true;
        // }
        DWORD attribs = ::GetFileAttributesA(abs_path.c_str());
        if (attribs == INVALID_FILE_ATTRIBUTES) {
            return CreateDirectoryA (abs_path.c_str(), NULL);
        }
        else {
            return (attribs & FILE_ATTRIBUTE_DIRECTORY);
        }
#else
        struct stat s;
        if (stat(abs_path.c_str(), &s) != 0) {
            std::string cmd = "mkdir -p " + string(abs_path);
            return system(cmd.c_str()) == 0;
        }
        else {
            return true;
        }
#endif
    }